

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O0

int __thiscall Fl_Browser::lineno(Fl_Browser *this,void *item)

{
  int local_48;
  int local_44;
  int n;
  int fnum;
  FL_BLINE *f;
  FL_BLINE *pFStack_30;
  int bnum;
  FL_BLINE *b;
  FL_BLINE *l;
  void *item_local;
  Fl_Browser *this_local;
  
  if (item == (void *)0x0) {
    this_local._4_4_ = 0;
  }
  else if ((FL_BLINE *)item == this->cache) {
    this_local._4_4_ = this->cacheline;
  }
  else if ((FL_BLINE *)item == this->first) {
    this_local._4_4_ = 1;
  }
  else if ((FL_BLINE *)item == this->last) {
    this_local._4_4_ = this->lines;
  }
  else {
    if (this->cache == (FL_BLINE *)0x0) {
      this->cache = this->first;
      this->cacheline = 1;
    }
    pFStack_30 = this->cache->prev;
    f._4_4_ = this->cacheline + -1;
    _n = this->cache->next;
    local_44 = this->cacheline + 1;
    while (pFStack_30 != (FL_BLINE *)item) {
      if (_n == (FL_BLINE *)item) {
        local_48 = local_44;
        goto LAB_001d3b09;
      }
      if (pFStack_30 != (FL_BLINE *)0x0) {
        pFStack_30 = pFStack_30->prev;
        f._4_4_ = f._4_4_ + -1;
      }
      if (_n != (FL_BLINE *)0x0) {
        _n = _n->next;
        local_44 = local_44 + 1;
      }
    }
    local_48 = f._4_4_;
LAB_001d3b09:
    this->cache = (FL_BLINE *)item;
    this->cacheline = local_48;
    this_local._4_4_ = local_48;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Browser::lineno(void *item) const {
  FL_BLINE* l = (FL_BLINE*)item;
  if (!l) return 0;
  if (l == cache) return cacheline;
  if (l == first) return 1;
  if (l == last) return lines;
  if (!cache) {
    ((Fl_Browser*)this)->cache = first;
    ((Fl_Browser*)this)->cacheline = 1;
  }
  // assume it is near cache, search both directions:
  FL_BLINE* b = cache->prev;
  int bnum = cacheline-1;
  FL_BLINE* f = cache->next;
  int fnum = cacheline+1;
  int n = 0;
  for (;;) {
    if (b == l) {n = bnum; break;}
    if (f == l) {n = fnum; break;}
    if (b) {b = b->prev; bnum--;}
    if (f) {f = f->next; fnum++;}
  }
  ((Fl_Browser*)this)->cache = l;
  ((Fl_Browser*)this)->cacheline = n;
  return n;
}